

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O3

walk_result __thiscall
jsoncons::jsonschema::
min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_validate(min_items_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *context,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
             json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_6)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar4;
  undefined1 *puVar5;
  long *plVar6;
  undefined1 *puVar7;
  uint uVar8;
  long *plVar9;
  walk_result wVar10;
  char cVar11;
  string __str;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  uint local_198;
  long local_190 [2];
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  long *local_148;
  long local_138 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long *local_a0;
  long local_90 [2];
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_80;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  
  pbVar4 = instance;
  while (uVar8 = (byte)(pbVar4->field_0).json_ref_ & 0xf, uVar8 - 8 < 2) {
    pbVar4 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              ((long)&(pbVar4->field_0).byte_str_ + 8);
  }
  if (uVar8 != 0xe) {
    return advance;
  }
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::eval_context(&local_68,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  .keyword_name_);
  puVar5 = (undefined1 *)
           basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                     (instance);
  puVar7 = *(undefined1 **)
            &(this->
             super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             ).field_0xe0;
  if (puVar5 < puVar7) {
    cVar11 = '\x01';
    if ((undefined1 *)0x9 < puVar7) {
      puVar5 = puVar7;
      cVar2 = '\x04';
      do {
        cVar11 = cVar2;
        if (puVar5 < (undefined1 *)0x64) {
          cVar11 = cVar11 + -2;
          goto LAB_00458e89;
        }
        if (puVar5 < (undefined1 *)0x3e8) {
          cVar11 = cVar11 + -1;
          goto LAB_00458e89;
        }
        if (puVar5 < &DAT_00002710) goto LAB_00458e89;
        bVar1 = (undefined1 *)0x1869f < puVar5;
        puVar5 = (undefined1 *)((ulong)puVar5 / 10000);
        cVar2 = cVar11 + '\x04';
      } while (bVar1);
      cVar11 = cVar11 + '\x01';
    }
LAB_00458e89:
    local_180 = &local_170;
    std::__cxx11::string::_M_construct((ulong)&local_180,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_180,(uint)local_178,(unsigned_long)puVar7);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,0x87c67c);
    local_1c0 = &local_1b0;
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_1b0 = *plVar9;
      lStack_1a8 = plVar6[3];
    }
    else {
      local_1b0 = *plVar9;
      local_1c0 = (long *)*plVar6;
    }
    local_1b8 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    puVar7 = (undefined1 *)
             basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                       (instance);
    cVar11 = '\x01';
    if ((undefined1 *)0x9 < puVar7) {
      puVar5 = puVar7;
      cVar2 = '\x04';
      do {
        cVar11 = cVar2;
        if (puVar5 < (undefined1 *)0x64) {
          cVar11 = cVar11 + -2;
          goto LAB_00458f93;
        }
        if (puVar5 < (undefined1 *)0x3e8) {
          cVar11 = cVar11 + -1;
          goto LAB_00458f93;
        }
        if (puVar5 < &DAT_00002710) goto LAB_00458f93;
        bVar1 = (undefined1 *)0x1869f < puVar5;
        puVar5 = (undefined1 *)((ulong)puVar5 / 10000);
        cVar2 = cVar11 + '\x04';
      } while (bVar1);
      cVar11 = cVar11 + '\x01';
    }
LAB_00458f93:
    local_1a0 = local_190;
    std::__cxx11::string::_M_construct((ulong)&local_1a0,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_1a0,local_198,(unsigned_long)puVar7);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,0x87cb06);
    plVar9 = plVar6 + 2;
    if ((long *)*plVar6 == plVar9) {
      local_170 = *plVar9;
      lStack_168 = plVar6[3];
      local_180 = &local_170;
    }
    else {
      local_170 = *plVar9;
      local_180 = (long *)*plVar6;
    }
    local_178 = plVar6[1];
    *plVar6 = (long)plVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_180);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1a0 != local_190) {
      operator_delete(local_1a0,local_190[0] + 1);
    }
    (*(this->
      super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).
      super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      .super_validation_message_factory._vptr_validation_message_factory[2])
              (&local_180,this,&local_68.eval_path_,instance_location,&local_1c0);
    reporter->error_count_ = reporter->error_count_ + 1;
    iVar3 = (*reporter->_vptr_error_reporter[2])(reporter,&local_180);
    std::
    vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
    ::~vector(&local_80);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    if (local_148 != local_138) {
      operator_delete(local_148,local_138[0] + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_160);
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,local_1b0 + 1);
    }
    wVar10 = abort;
    if (iVar3 == 1) goto LAB_00459144;
  }
  wVar10 = advance;
LAB_00459144:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68.eval_path_.tokens_);
  if (local_68.dynamic_scope_.
      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.dynamic_scope_.
                    super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.dynamic_scope_.
                          super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return wVar10;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter,
            Json& /*patch*/) const final
        {
            if (!instance.is_array())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            if (instance.size() < min_items_)
            {
                std::string message("Minimum number of items is " + std::to_string(min_items_));
                message.append(" but found " + std::to_string(instance.size()));
                walk_result result = reporter.error(this->make_validation_message(
                    this_context.eval_path(),
                    instance_location, 
                    std::move(message)));
                if (result == walk_result::abort)
                {
                    return result;
                }
            }          
            return walk_result::advance;
        }